

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qringbuffer.cpp
# Opt level: O2

char * __thiscall QRingBuffer::reserve(QRingBuffer *this,qint64 bytes)

{
  int iVar1;
  QRingChunk *pQVar2;
  Data *pDVar3;
  iterator iVar4;
  char *pcVar5;
  long lVar6;
  qint64 alloc;
  long in_FS_OFFSET;
  QRingChunk local_50;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = this->basicBlockSize;
  alloc = bytes;
  if (bytes < iVar1) {
    alloc = (long)iVar1;
  }
  if (this->bufferSize == 0) {
    if ((this->buffers).d.size == 0) goto LAB_0015b257;
    iVar4 = QList<QRingChunk>::begin(&this->buffers);
    QRingChunk::allocate(iVar4.i,alloc);
  }
  else {
    if (iVar1 != 0) {
      lVar6 = (this->buffers).d.size;
      pQVar2 = (this->buffers).d.ptr;
      pDVar3 = pQVar2[lVar6 + -1].chunk.d.d;
      if (((pDVar3 != (Data *)0x0) &&
          ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> == 1)) &&
         (bytes <= pQVar2[lVar6 + -1].chunk.d.size - pQVar2[lVar6 + -1].tailOffset)) {
        lVar6 = pQVar2[lVar6 + -1].tailOffset - pQVar2[lVar6 + -1].headOffset;
        goto LAB_0015b27d;
      }
    }
LAB_0015b257:
    QRingChunk::QRingChunk(&local_50,alloc);
    QList<QRingChunk>::emplaceBack<QRingChunk>(&this->buffers,&local_50);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_50);
  }
  lVar6 = 0;
LAB_0015b27d:
  iVar4 = QList<QRingChunk>::end(&this->buffers);
  iVar4.i[-1].tailOffset = iVar4.i[-1].tailOffset + bytes;
  this->bufferSize = this->bufferSize + bytes;
  iVar4 = QList<QRingChunk>::end(&this->buffers);
  pcVar5 = QRingChunk::data(iVar4.i + -1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pcVar5 + lVar6;
  }
  __stack_chk_fail();
}

Assistant:

char *QRingBuffer::reserve(qint64 bytes)
{
    Q_ASSERT(bytes > 0 && bytes < QByteArray::maxSize());

    const qsizetype chunkSize = qMax(qint64(basicBlockSize), bytes);
    qsizetype tail = 0;
    if (bufferSize == 0) {
        if (buffers.isEmpty())
            buffers.append(QRingChunk(chunkSize));
        else
            buffers.first().allocate(chunkSize);
    } else {
        const QRingChunk &chunk = buffers.constLast();
        // if need a new buffer
        if (basicBlockSize == 0 || chunk.isShared() || bytes > chunk.available())
            buffers.append(QRingChunk(chunkSize));
        else
            tail = chunk.size();
    }

    buffers.last().grow(bytes);
    bufferSize += bytes;
    return buffers.last().data() + tail;
}